

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SHA1.cpp
# Opt level: O2

void __thiscall CSHA1::~CSHA1(CSHA1 *this)

{
  this->m_state[0] = 0x67452301;
  this->m_state[1] = 0xefcdab89;
  this->m_state[2] = 0x98badcfe;
  this->m_state[3] = 0x10325476;
  *(undefined8 *)(this->m_state + 4) = 0xc3d2e1f0;
  this->m_count[1] = 0;
  return;
}

Assistant:

void CSHA1::Reset()
{
	// SHA1 initialization constants
	m_state[0] = 0x67452301;
	m_state[1] = 0xEFCDAB89;
	m_state[2] = 0x98BADCFE;
	m_state[3] = 0x10325476;
	m_state[4] = 0xC3D2E1F0;

	m_count[0] = 0;
	m_count[1] = 0;
}